

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avl.h
# Opt level: O0

avl_node_t * avl_iter_next(avl_iter_t *iter)

{
  bool bVar1;
  avl_node_t *result;
  avl_iter_t *iter_local;
  
  if (iter[1].height == 0) {
    iter_local = (avl_iter_t *)0x0;
  }
  else {
    while (iter[iter->height + 1].height != 0) {
      iter[iter->height + 2].height = *(size_t *)iter[iter->height + 1].height;
      iter->height = iter->height + 1;
    }
    iter_local = (avl_iter_t *)iter[iter->height].height;
    if (iter_local[1].height == 0) {
      do {
        iter->height = iter->height - 1;
        bVar1 = false;
        if (iter->height != 0) {
          bVar1 = iter[iter->height + 1].height == *(size_t *)(iter[iter->height].height + 8);
        }
      } while (bVar1);
      iter[iter->height + 1].height = 0;
    }
    else {
      iter[iter->height + 1].height = iter_local[1].height;
    }
  }
  return (avl_node_t *)iter_local;
}

Assistant:

static inline avl_node_t*
avl_iter_next(avl_iter_t *iter)
{
    /* when first node is NULL, we're done */
    if (iter->nodes[0] == NULL) return NULL;

    /* if the head is not NULL, first entry... */
    while (iter->nodes[iter->height] != NULL) {
        iter->nodes[iter->height+1] = iter->nodes[iter->height]->left;
        iter->height++;
    }

    /* head is now NULL, take parent as result */
    avl_node_t *result = iter->nodes[iter->height-1];

    if (result->right != NULL) {
        /* if we can go right, do that */
        iter->nodes[iter->height] = result->right;
    } else {
        /* cannot go right, backtrack */
        do {
            iter->height--;
        } while (iter->height > 0 && iter->nodes[iter->height] == iter->nodes[iter->height-1]->right);
        iter->nodes[iter->height] = NULL; /* set head to NULL: second entry */
    }

    return result;
}